

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS ref_mpi_stopwatch_delta(REF_MPI ref_mpi,REF_DBL *delta)

{
  clock_t cVar1;
  REF_STATUS ref_private_macro_code_rss;
  clock_t ticks;
  REF_DBL *delta_local;
  REF_MPI ref_mpi_local;
  
  cVar1 = clock();
  *delta = (double)cVar1 / 1000000.0 - ref_mpi->start_time;
  ref_mpi_local._4_4_ = ref_mpi_stopwatch_start(ref_mpi);
  if (ref_mpi_local._4_4_ == 0) {
    ref_mpi_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x148,
           "ref_mpi_stopwatch_delta",(ulong)ref_mpi_local._4_4_,"restart");
  }
  return ref_mpi_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_stopwatch_delta(REF_MPI ref_mpi, REF_DBL *delta) {
#ifdef HAVE_MPI
  REF_DBL after_barrier;
  if (ref_mpi_para(ref_mpi)) MPI_Barrier(ref_mpi_comm(ref_mpi));
  after_barrier = (REF_DBL)MPI_Wtime();
  after_barrier = after_barrier - ref_mpi->start_time;
  RSS(ref_mpi_min(ref_mpi, &after_barrier, delta, REF_DBL_TYPE), "max");
  RSS(ref_mpi_stopwatch_start(ref_mpi), "restart");
#else
  clock_t ticks;
  ticks = clock();
  *delta = ((REF_DBL)ticks) / ((REF_DBL)CLOCKS_PER_SEC) - ref_mpi->start_time;
  RSS(ref_mpi_stopwatch_start(ref_mpi), "restart");
#endif

  return REF_SUCCESS;
}